

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O1

LispPTR N_OP_lsh(LispPTR a,LispPTR b)

{
  uint uVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  
  if ((b & 0xfff0000) == 0xf0000) {
    uVar4 = b | 0xffff0000;
  }
  else if ((b & 0xfff0000) == 0xe0000) {
    uVar4 = b & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(b >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = b;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((b & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)b);
    }
    uVar4 = *(uint *)(Lisp_world + b);
  }
  if ((a & 0xfff0000) == 0xf0000) {
    uVar1 = a | 0xffff0000;
  }
  else if ((a & 0xfff0000) == 0xe0000) {
    uVar1 = a & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(a >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = b;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((a & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)a);
    }
    uVar1 = *(uint *)(Lisp_world + a);
  }
  bVar3 = (byte)uVar4;
  if ((int)uVar4 < 1) {
    if (-1 < (int)uVar4) {
      return a;
    }
    if (-0x20 < (int)uVar4) {
      uVar4 = (int)uVar1 >> (-bVar3 & 0x1f);
      goto LAB_001301f4;
    }
  }
  else if (((int)uVar4 < 0x20) &&
          (uVar4 = uVar1 << (bVar3 & 0x1f), (int)uVar4 >> (bVar3 & 0x1f) == uVar1)) {
LAB_001301f4:
    if ((uVar4 & 0xffff0000) == 0xffff0000) {
      return uVar4 & 0xffff | 0xf0000;
    }
    if ((uVar4 & 0xffff0000) != 0) {
      puVar2 = (uint *)createcell68k(2);
      *puVar2 = uVar4;
      if (((ulong)puVar2 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar2);
      }
      return (LispPTR)((ulong)((long)puVar2 - (long)Lisp_world) >> 1);
    }
    return uVar4 | 0xe0000;
  }
  MachineState.errorexit = 1;
  MachineState.tosvalue = b;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_lsh(LispPTR a, LispPTR b) {
  int arg, arg2;
  int size;
  /*DLword	*wordp;*/

  N_GETNUMBER(b, size, do_ufn);
  N_GETNUMBER(a, arg2, do_ufn);

  if (size > 0) {
    if (size > 31) goto do_ufn;
    arg = arg2 << size;
    if ((arg >> size) != arg2) goto do_ufn;
  } else if (size < 0) {
    if (size < -31) goto do_ufn;
    arg = arg2 >> -size;
    /*** Commented out JDS 1/27/89:  This punts if you shifted ***/
    /*** ANY 1 bits off the right edge.  You CAN'T overflow    ***/
    /*** in this direction!!                                   ***/
    /*		if ((arg << -size) != arg2) goto do_ufn; */
  } else
    return (a);

  N_ARITH_SWITCH(arg);

do_ufn:
  ERROR_EXIT(b);
}